

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O3

void __thiscall ipx::Iterate::Postprocess(Iterate *this)

{
  int iVar1;
  int iVar2;
  StateDetail SVar3;
  Model *pMVar4;
  pointer pSVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  pointer piVar13;
  uint uVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  pMVar4 = this->model_;
  uVar14 = pMVar4->num_cols_ + pMVar4->num_rows_;
  if (uVar14 != 0 && SCARRY4(pMVar4->num_cols_,pMVar4->num_rows_) == (int)uVar14 < 0) {
    pSVar5 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (this->x_)._M_data;
    pdVar7 = (this->xl_)._M_data;
    pdVar8 = (this->xu_)._M_data;
    pdVar9 = (this->y_)._M_data;
    pdVar10 = (this->zl_)._M_data;
    pdVar11 = (this->zu_)._M_data;
    uVar17 = 0;
    do {
      if (pSVar5[uVar17] == FIXED) {
        pdVar12 = (pMVar4->lb_)._M_data;
        pdVar7[uVar17] = pdVar6[uVar17] - pdVar12[uVar17];
        pdVar15 = (pMVar4->ub_)._M_data;
        pdVar8[uVar17] = pdVar15[uVar17] - pdVar6[uVar17];
        dVar18 = pdVar12[uVar17];
        pdVar15 = pdVar15 + uVar17;
        if ((dVar18 == *pdVar15) && (!NAN(dVar18) && !NAN(*pdVar15))) {
          piVar13 = (pMVar4->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar1 = piVar13[uVar17];
          lVar16 = (long)iVar1;
          iVar2 = piVar13[uVar17 + 1];
          dVar18 = 0.0;
          if (iVar1 < iVar2) {
            do {
              dVar18 = dVar18 + pdVar9[(pMVar4->AI_).rowidx_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar16]] *
                                (pMVar4->AI_).values_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar16];
              lVar16 = lVar16 + 1;
            } while (iVar2 != lVar16);
          }
          dVar18 = (pMVar4->c_)._M_data[uVar17] - dVar18;
          dVar19 = -dVar18;
          pdVar15 = pdVar10;
          if (dVar18 < dVar19) {
            pdVar15 = pdVar11;
          }
          pdVar15[uVar17] =
               (double)(~-(ulong)(dVar18 < dVar19) & (ulong)dVar18 |
                       (ulong)dVar19 & -(ulong)(dVar18 < dVar19));
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar14);
    if (0 < (int)uVar14) {
      pSVar5 = (this->variable_state_).
               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (this->y_)._M_data;
      pdVar7 = (this->zl_)._M_data;
      pdVar8 = (this->zu_)._M_data;
      pdVar9 = (this->x_)._M_data;
      pdVar10 = (this->xl_)._M_data;
      pdVar11 = (this->xu_)._M_data;
      uVar17 = 0;
      do {
        SVar3 = pSVar5[uVar17];
        if (SVar3 - IMPLIED_LB < 3) {
          piVar13 = (pMVar4->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar1 = piVar13[uVar17];
          lVar16 = (long)iVar1;
          iVar2 = piVar13[uVar17 + 1];
          dVar18 = 0.0;
          if (iVar1 < iVar2) {
            do {
              dVar18 = dVar18 + pdVar6[(pMVar4->AI_).rowidx_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar16]] *
                                (pMVar4->AI_).values_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar16];
              lVar16 = lVar16 + 1;
            } while (iVar2 != lVar16);
          }
          dVar18 = (pMVar4->c_)._M_data[uVar17] - dVar18;
          if (SVar3 == IMPLIED_LB) {
            pdVar7[uVar17] = dVar18;
            pdVar8[uVar17] = 0.0;
LAB_0039e906:
            pdVar15 = (pMVar4->lb_)._M_data;
LAB_0039e90d:
            dVar18 = pdVar15[uVar17];
            pdVar9[uVar17] = dVar18;
          }
          else {
            if (SVar3 == IMPLIED_UB) {
              pdVar7[uVar17] = 0.0;
              pdVar8[uVar17] = -dVar18;
              pdVar15 = (pMVar4->ub_)._M_data;
              goto LAB_0039e90d;
            }
            if (SVar3 == IMPLIED_EQ) {
              dVar20 = -dVar18;
              dVar19 = 0.0;
              if (dVar20 <= dVar18) {
                dVar19 = dVar18;
              }
              pdVar7[uVar17] = dVar19;
              pdVar8[uVar17] = (double)(-(ulong)(dVar18 < dVar20) & (ulong)dVar20);
              goto LAB_0039e906;
            }
            dVar18 = pdVar9[uVar17];
          }
          pdVar10[uVar17] = dVar18 - (pMVar4->lb_)._M_data[uVar17];
          pdVar11[uVar17] = (pMVar4->ub_)._M_data[uVar17] - pdVar9[uVar17];
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar14);
    }
  }
  this->evaluated_ = false;
  this->postprocessed_ = true;
  return;
}

Assistant:

void Iterate::Postprocess() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& c = model_.c();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    // For fixed variables compute xl[j] and xu[j] from x[j]. If the lower and
    // upper bound are equal, set zl[j] or zu[j] such that the variable is dual
    // feasible. Otherwise leave them zero.
    for (Int j = 0; j < n+m; j++) {
        if (StateOf(j) == State::fixed) {
            xl_[j] = x_[j] - lb[j];
            xu_[j] = ub[j] - x_[j];
            assert(zl_[j] == 0.0);
            assert(zu_[j] == 0.0);
            if (lb[j] == ub[j]) {
                double z = c[j] - DotColumn(AI, j, y_);
                if (z >= 0.0)
                    zl_[j] = z;
                else
                    zu_[j] = -z;
            }
        }
    }
    // For implied variables set x[j] to the bound at which it was implied and
    // compute zl[j] or zu[j]. If the variable was implied at both bounds,
    // choose between zl and zu depending on sign.
    for (Int j = 0; j < n+m; j++) {
        if (is_implied(j)) {
            double z = c[j] - DotColumn(AI, j, y_);
            switch (variable_state_[j]) {
            case StateDetail::IMPLIED_EQ:
                assert(lb[j] == ub[j]);
                if (z >= 0.0) {
                    zl_[j] = z;
                    zu_[j] = 0.0;
                } else {
                    zl_[j] = 0.0;
                    zu_[j] = -z;
                }
                x_[j] = lb[j];
                break;
            case StateDetail::IMPLIED_LB:
                zl_[j] = z;
                zu_[j] = 0.0;
                x_[j] = lb[j];
                break;
            case StateDetail::IMPLIED_UB:
                zl_[j] = 0.0;
                zu_[j] = -z;
                x_[j] = ub[j];
                break;
            default:
                assert(0);
            }
            xl_[j] = x_[j] - lb[j];
            xu_[j] = ub[j] - x_[j];
        }
    }
    postprocessed_ = true;
    evaluated_ = false;
}